

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O0

int ly_write(lyout *out,char *buf,size_t count)

{
  ssize_t sVar1;
  size_t sVar2;
  FILE *pFVar3;
  LY_ERR *pLVar4;
  ssize_t sVar5;
  char *aux;
  size_t count_local;
  char *buf_local;
  lyout *out_local;
  
  switch(out->type) {
  case LYOUT_FD:
    sVar1 = write((out->method).fd,buf,count);
    out_local._4_4_ = (int)sVar1;
    break;
  case LYOUT_STREAM:
    sVar2 = fwrite(buf,1,count,(FILE *)(out->method).f);
    out_local._4_4_ = (int)sVar2;
    break;
  case LYOUT_MEMORY:
    if ((out->method).mem.size < (long)(out->method).clb.arg + count + 1) {
      pFVar3 = (FILE *)ly_realloc((out->method).f,(long)(out->method).clb.arg + count + 1);
      if (pFVar3 == (FILE *)0x0) {
        (out->method).f = (FILE *)0x0;
        (out->method).mem.len = 0;
        (out->method).mem.size = 0;
        pLVar4 = ly_errno_location();
        *pLVar4 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","ly_write");
        return -1;
      }
      (out->method).f = pFVar3;
      (out->method).mem.size = (long)(out->method).clb.arg + count + 1;
    }
    memcpy((void *)((long)&((out->method).f)->_flags + (long)(out->method).clb.arg),buf,count + 1);
    (out->method).clb.arg = (void *)(count + (long)(out->method).clb.arg);
    out_local._4_4_ = (int)count;
    break;
  case LYOUT_CALLBACK:
    sVar5 = (*(out->method).clb.f)((void *)(out->method).mem.len,buf,count);
    out_local._4_4_ = (int)sVar5;
    break;
  default:
    out_local._4_4_ = 0;
  }
  return out_local._4_4_;
}

Assistant:

int
ly_write(struct lyout *out, const char *buf, size_t count)
{
    char *aux;

    switch(out->type) {
    case LYOUT_FD:
        return write(out->method.fd, buf, count);
    case LYOUT_STREAM:
        return fwrite(buf, sizeof *buf, count, out->method.f);
    case LYOUT_MEMORY:
        if (out->method.mem.len + count + 1 > out->method.mem.size) {
            aux = ly_realloc(out->method.mem.buf, out->method.mem.len + count + 1);
            if (!aux) {
                out->method.mem.buf = NULL;
                out->method.mem.len = 0;
                out->method.mem.size = 0;
                LOGMEM;
                return -1;
            }
            out->method.mem.buf = aux;
            out->method.mem.size = out->method.mem.len + count + 1;
        }
        memcpy(&out->method.mem.buf[out->method.mem.len], buf, count + 1);
        out->method.mem.len += count;
        return count;
    case LYOUT_CALLBACK:
        return out->method.clb.f(out->method.clb.arg, buf, count);
    }

    return 0;
}